

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_24::SourceLocationCommentPrinter::SourceLocationCommentPrinter
          (SourceLocationCommentPrinter *this,FileDescriptor *file,
          vector<int,_std::allocator<int>_> *path,string *prefix,DebugStringOptions *options)

{
  bool bVar1;
  bool local_59;
  DebugStringOptions *options_local;
  string *prefix_local;
  vector<int,_std::allocator<int>_> *path_local;
  FileDescriptor *file_local;
  SourceLocationCommentPrinter *this_local;
  
  SourceLocation::SourceLocation(&this->source_loc_);
  (this->options_).elide_oneof_body = options->elide_oneof_body;
  bVar1 = options->elide_group_body;
  (this->options_).include_comments = options->include_comments;
  (this->options_).elide_group_body = bVar1;
  std::__cxx11::string::string((string *)&this->prefix_,(string *)prefix);
  local_59 = false;
  if ((options->include_comments & 1U) != 0) {
    local_59 = FileDescriptor::GetSourceLocation(file,path,&this->source_loc_);
  }
  this->have_source_loc_ = local_59;
  return;
}

Assistant:

SourceLocationCommentPrinter(const FileDescriptor* file,
                               const std::vector<int>& path,
                               const std::string& prefix,
                               const DebugStringOptions& options)
      : options_(options), prefix_(prefix) {
    // Perform the SourceLocation lookup only if we're including user comments,
    // because the lookup is fairly expensive.
    have_source_loc_ =
        options.include_comments && file->GetSourceLocation(path, &source_loc_);
  }